

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 c_v64_ziplo_8(c_v64 a,c_v64 b)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = a.u32[0];
  uVar1 = b.u32[0];
  return (c_v64)(b.u64 & 0xff |
                 (ulong)((uVar2 & 0xff) << 8) |
                 (ulong)((uVar2 & 0xff00) << 0x10) |
                 (ulong)(uVar2 & 0xff0000) << 0x18 | (ulong)(uVar2 & 0xff000000) << 0x20 |
                 (ulong)(uVar1 & 0xff000000) << 0x18 | (ulong)(uVar1 & 0xff0000) << 0x10 |
                (ulong)((uVar1 & 0xff00) << 8));
}

Assistant:

SIMD_INLINE c_v64 _c_v64_zip_8(c_v64 a, c_v64 b, int mode) {
  c_v64 t;
  if (mode) {
    t.u8[7] = a.u8[7];
    t.u8[6] = b.u8[7];
    t.u8[5] = a.u8[6];
    t.u8[4] = b.u8[6];
    t.u8[3] = a.u8[5];
    t.u8[2] = b.u8[5];
    t.u8[1] = a.u8[4];
    t.u8[0] = b.u8[4];
  } else {
    t.u8[7] = a.u8[3];
    t.u8[6] = b.u8[3];
    t.u8[5] = a.u8[2];
    t.u8[4] = b.u8[2];
    t.u8[3] = a.u8[1];
    t.u8[2] = b.u8[1];
    t.u8[1] = a.u8[0];
    t.u8[0] = b.u8[0];
  }
  return t;
}